

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O1

int css(double *inp,int N,int optmethod,int p,int d,int q,double *phi,double *theta,double *wmean,
       double *var,double *resid,double *loglik,double *hess)

{
  size_t __size;
  int N_00;
  uint uVar1;
  double *oup;
  alik_css_object __ptr;
  double *xi;
  double *xf;
  double *col;
  double *dx;
  int *ipiv;
  long lVar2;
  int N_01;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  double dVar6;
  undefined1 local_a8 [8];
  custom_function fcss_min;
  
  uVar3 = (ulong)(uint)N;
  oup = (double *)malloc((long)(N - d) << 3);
  if (d < 1) {
    dVar6 = mean(inp,N);
    *wmean = dVar6;
    if (0 < N) {
      memcpy(oup,inp,(ulong)(uint)N << 3);
    }
  }
  else {
    uVar1 = diff(inp,N,d,oup);
    uVar3 = (ulong)uVar1;
    *wmean = 0.0;
  }
  N_01 = (int)uVar3;
  __ptr = alik_css_init(p,d,q,N_01);
  N_00 = __ptr->pq;
  lVar5 = (long)N_00;
  __size = lVar5 * 8;
  xi = (double *)malloc(__size);
  xf = (double *)malloc(__size);
  col = (double *)malloc(__size * lVar5);
  dx = (double *)malloc(__size);
  ipiv = (int *)malloc(lVar5 * 4);
  __ptr->N = N_01;
  dVar6 = *wmean;
  __ptr->mean = dVar6;
  fcss_min.params = (void *)(ulong)(uint)p;
  if (0 < p) {
    memset(xi,0,(long)fcss_min.params * 8);
  }
  if (0 < q) {
    memset(xi + p,0,(ulong)(uint)q * 8);
  }
  if (__ptr->M == 1) {
    xi[q + p] = dVar6;
  }
  if (0 < N_01) {
    uVar4 = 0;
    do {
      dVar6 = oup[uVar4];
      __ptr->x[(uint)(N_01 * 2) + uVar4] = dVar6;
      __ptr->x[uVar4] = dVar6;
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  if (N_01 < N_01 * 2) {
    memset(__ptr->x + N_01,0,(ulong)(N_01 - 1) * 8 + 8);
  }
  local_a8 = (undefined1  [8])fcss;
  fcss_min.funcpt = (_func_double_double_ptr_int_void_ptr *)__ptr;
  uVar1 = fminunc((custom_function *)local_a8,(custom_gradient *)0x0,N_00,xi,1.0,optmethod,xf);
  if ((0xf < uVar1) || ((0x8011U >> (uVar1 & 0x1f) & 1) == 0)) {
    uVar1 = 1;
  }
  if (0 < N_00) {
    lVar2 = 0;
    do {
      dx[lVar2] = 1.0;
      lVar2 = lVar2 + 1;
    } while (lVar5 != lVar2);
  }
  hessian_fd((custom_function *)local_a8,xf,N_00,dx,__ptr->eps,hess);
  mtranspose(hess,N_00,N_00,col);
  if (N_00 != 0) {
    uVar3 = 0;
    do {
      col[uVar3] = (hess[uVar3] + col[uVar3]) * (double)(N_01 - d) * 0.5;
      uVar3 = uVar3 + 1;
    } while (N_00 * N_00 + (uint)(N_00 * N_00 == 0) != uVar3);
  }
  ludecomp(col,N_00,ipiv);
  minverse(col,N_00,ipiv,hess);
  if (0 < p) {
    memcpy(phi,xf,(long)fcss_min.params << 3);
  }
  if (0 < q) {
    uVar3 = 0;
    do {
      theta[uVar3] = -xf[(long)p + uVar3];
      uVar3 = uVar3 + 1;
    } while ((uint)q != uVar3);
  }
  dVar6 = 0.0;
  if (__ptr->M == 1) {
    dVar6 = xf[q + p];
  }
  *wmean = dVar6;
  *var = __ptr->ssq / (double)N_01;
  if (d < N_01) {
    memcpy(resid,__ptr->x + N_01,(ulong)(uint)(~d + N_01) * 8 + 8);
  }
  *loglik = __ptr->loglik;
  free(xi);
  free(xf);
  free(oup);
  free(col);
  free(dx);
  free(ipiv);
  free(__ptr);
  return uVar1;
}

Assistant:

int css(double *inp, int N, int optmethod, int p, int d, int q, double *phi, double *theta, double *wmean,double *var,double *resid,double *loglik,double *hess) {
	int i, pq, retval, length,M,ret;
	double *b, *tf, *x,*dx,*thess;
	int *ipiv;
	double maxstep;
	alik_css_object obj;

	x = (double*)malloc(sizeof(double)* (N - d));


	length = N;

	maxstep = 1.0;

	/*

	*/

	if (d > 0) {
		N = diff(inp, N, d, x); // No need to demean x
		M = 0;
		*wmean = 0.0;
	}
	else {
		*wmean = mean(inp, N);
		for (i = 0; i < N; ++i) {
			x[i] = inp[i];
		}
		M = 1;
	}

	obj = alik_css_init(p, d, q, N);
	pq = obj->pq;
	b = (double*)malloc(sizeof(double)* pq);
	tf = (double*)malloc(sizeof(double)* pq);
	thess = (double*)malloc(sizeof(double)* pq*pq);
	dx = (double*)malloc(sizeof(double)* pq);
	ipiv = (int*)malloc(sizeof(int)* pq);

	obj->N = N;
	obj->mean = *wmean;


	for (i = 0; i < p; ++i) {
		b[i] = 0.0;
	}
	for (i = 0; i < q; ++i) {
		b[p + i] = 0.0;
	}

	if (obj->M == 1) {
		b[p + q] = obj->mean;
	}

	for (i = 0; i < N; ++i) {
		obj->x[i] = obj->x[2*N+i] = x[i];
	}
	for (i = N; i < 2 * N; ++i) {
		obj->x[i] = 0.0;
	}

	custom_function fcss_min = { fcss, obj };
	retval = fminunc(&fcss_min, NULL, pq, b, maxstep, optmethod, tf);

	if (retval == 0) {
		ret = 0;
	} else if (retval == 15) {
		ret = 15;
	} else if (retval == 4) {
		ret = 4;
	}
	else {
		ret = 1;
	}

	for (i = 0; i < pq; ++i) {
		dx[i] = 1.0;
	}

	hessian_fd(&fcss_min, tf, pq, dx, obj->eps, hess);
	//mdisplay(hess, pq, pq);
	mtranspose(hess, pq, pq, thess);

	for (i = 0; i < pq*pq; ++i) {
		thess[i] = (N - d) * 0.5 * (hess[i] + thess[i]);
	}


	ludecomp(thess, pq, ipiv);
	minverse(thess, pq, ipiv, hess);

	for (i = 0; i < p; ++i) {
		phi[i] = tf[i];
	}
	for (i = 0; i < q; ++i) {
		theta[i] = -tf[p + i];
	}
	if (obj->M == 1) {
		*wmean = tf[p + q];
	}
	else {
		*wmean = 0.0;
	}
	/*
	if (M == 1) {
		temp = 0.0;
		for (i = 0; i < p; ++i) {
			temp += phi[i];
		}
		*wmean = *wmean * (1.0 - temp);
	}
	else {
		*wmean = 0.0;
	}
	*/
	*var = (obj->ssq) / (double)N;
	for (i = 0; i < N - d; ++i) {
		resid[i] = obj->x[N+i];
	}
	*loglik = obj->loglik;
	//printf("MEAN %g \n", mean(obj->x+N,N));
	//mdisplay(obj->x + N, 1, N);

	free(b);
	free(tf);
	free(x);
	free(thess);
	free(dx);
	free(ipiv);
	free_alik_css(obj);
	return ret;
}